

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitByBoneCountProcess.cpp
# Opt level: O3

void __thiscall
Assimp::SplitByBoneCountProcess::Execute(SplitByBoneCountProcess *this,aiScene *pScene)

{
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_00;
  byte bVar1;
  aiMesh *paVar2;
  byte bVar3;
  uint uVar4;
  Logger *pLVar5;
  aiMesh **__dest;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  aiMesh *srcMesh;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> newMeshes;
  void *local_1f8;
  iterator iStack_1f0;
  aiMesh **local_1e8;
  uint local_1dc;
  aiMesh *local_1d8 [2];
  undefined1 local_1c8 [32];
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> local_1a8 [4];
  ios_base local_138 [264];
  
  pLVar5 = DefaultLogger::get();
  Logger::debug(pLVar5,"SplitByBoneCountProcess begin");
  if ((ulong)pScene->mNumMeshes != 0) {
    uVar8 = 0;
    bVar3 = 0;
    do {
      bVar1 = bVar3;
      bVar9 = this->mMaxBoneCount < (ulong)pScene->mMeshes[uVar8]->mNumBones;
      uVar8 = uVar8 + 1;
      bVar3 = bVar1 | bVar9;
    } while (pScene->mNumMeshes != uVar8);
    if ((bool)(bVar1 | bVar9)) {
      this_00 = &this->mSubMeshIndices;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::_M_erase_at_end(this_00,(this->mSubMeshIndices).
                                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::resize(this_00,(ulong)pScene->mNumMeshes);
      local_1f8 = (void *)0x0;
      iStack_1f0._M_current = (aiMesh **)0x0;
      local_1e8 = (aiMesh **)0x0;
      if (pScene->mNumMeshes == 0) {
        uVar4 = 0;
      }
      else {
        uVar8 = 0;
        local_1c8._16_8_ = pScene;
        local_1c8._24_8_ = this;
        do {
          local_1d8[0] = pScene->mMeshes[uVar8];
          local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          SplitMesh(this,pScene->mMeshes[uVar8],local_1a8);
          if (local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_1dc = (uint)((ulong)((long)iStack_1f0._M_current - (long)local_1f8) >> 3);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((this_00->
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar8,&local_1dc);
            if (iStack_1f0._M_current == local_1e8) {
              std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                        ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_1f8,iStack_1f0,local_1d8)
              ;
            }
            else {
              *iStack_1f0._M_current = local_1d8[0];
              iStack_1f0._M_current = iStack_1f0._M_current + 1;
            }
          }
          else {
            uVar6 = 0;
            uVar7 = 1;
            do {
              local_1dc = (uint)((ulong)((long)iStack_1f0._M_current - (long)local_1f8) >> 3);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                        ((this_00->
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar8,&local_1dc);
              if (iStack_1f0._M_current == local_1e8) {
                std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                          ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_1f8,iStack_1f0,
                           (aiMesh **)
                           ((float *)local_1a8[0].
                                     super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                                     .super__Vector_impl_data._M_start + uVar6 * 2));
              }
              else {
                *iStack_1f0._M_current =
                     *(aiMesh **)
                      ((float *)local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar6 * 2);
                iStack_1f0._M_current = iStack_1f0._M_current + 1;
              }
              this = (SplitByBoneCountProcess *)local_1c8._24_8_;
              paVar2 = local_1d8[0];
              bVar9 = uVar7 < (ulong)((long)local_1a8[0].
                                            super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_1a8[0].
                                            super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start >> 3);
              uVar6 = uVar7;
              uVar7 = (ulong)((int)uVar7 + 1);
            } while (bVar9);
            if (local_1d8[0] != (aiMesh *)0x0) {
              aiMesh::~aiMesh(local_1d8[0]);
            }
            operator_delete(paVar2,0x520);
            pScene = (aiScene *)local_1c8._16_8_;
          }
          if ((aiVector3D *)
              local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_start != (aiVector3D *)0x0) {
            operator_delete(local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_1a8[0].
                                  super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_1a8[0].
                                  super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < pScene->mNumMeshes);
        uVar4 = (uint)((ulong)((long)iStack_1f0._M_current - (long)local_1f8) >> 3);
      }
      pScene->mNumMeshes = uVar4;
      if (pScene->mMeshes != (aiMesh **)0x0) {
        operator_delete__(pScene->mMeshes);
        uVar4 = pScene->mNumMeshes;
      }
      __dest = (aiMesh **)operator_new__((ulong)uVar4 << 3);
      pScene->mMeshes = __dest;
      if ((long)iStack_1f0._M_current - (long)local_1f8 != 0) {
        memmove(__dest,local_1f8,(long)iStack_1f0._M_current - (long)local_1f8);
      }
      UpdateNode(this,pScene->mRootNode);
      pLVar5 = DefaultLogger::get();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"SplitByBoneCountProcess end: split ",0x23);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," meshes into ",0xd);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," submeshes.",0xb);
      std::__cxx11::stringbuf::str();
      Logger::debug(pLVar5,(char *)local_1d8[0]);
      if (local_1d8[0] != (aiMesh *)local_1c8) {
        operator_delete(local_1d8[0],local_1c8._0_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      if (local_1f8 == (void *)0x0) {
        return;
      }
      operator_delete(local_1f8,(long)local_1e8 - (long)local_1f8);
      return;
    }
  }
  pLVar5 = DefaultLogger::get();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"SplitByBoneCountProcess early-out: no meshes with more than ",
             0x3c);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," bones.",7);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar5,(char *)local_1d8[0]);
  if (local_1d8[0] != (aiMesh *)local_1c8) {
    operator_delete(local_1d8[0],local_1c8._0_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void SplitByBoneCountProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("SplitByBoneCountProcess begin");

    // early out
    bool isNecessary = false;
    for( unsigned int a = 0; a < pScene->mNumMeshes; ++a)
        if( pScene->mMeshes[a]->mNumBones > mMaxBoneCount )
            isNecessary = true;

    if( !isNecessary )
    {
        ASSIMP_LOG_DEBUG( format() << "SplitByBoneCountProcess early-out: no meshes with more than " << mMaxBoneCount << " bones." );
        return;
    }

    // we need to do something. Let's go.
    mSubMeshIndices.clear();
    mSubMeshIndices.resize( pScene->mNumMeshes);

    // build a new array of meshes for the scene
    std::vector<aiMesh*> meshes;

    for( unsigned int a = 0; a < pScene->mNumMeshes; ++a)
    {
        aiMesh* srcMesh = pScene->mMeshes[a];

        std::vector<aiMesh*> newMeshes;
        SplitMesh( pScene->mMeshes[a], newMeshes);

        // mesh was split
        if( !newMeshes.empty() )
        {
            // store new meshes and indices of the new meshes
            for( unsigned int b = 0; b < newMeshes.size(); ++b)
            {
                mSubMeshIndices[a].push_back( static_cast<unsigned int>(meshes.size()));
                meshes.push_back( newMeshes[b]);
            }

            // and destroy the source mesh. It should be completely contained inside the new submeshes
            delete srcMesh;
        }
        else
        {
            // Mesh is kept unchanged - store it's new place in the mesh array
            mSubMeshIndices[a].push_back( static_cast<unsigned int>(meshes.size()));
            meshes.push_back( srcMesh);
        }
    }

    // rebuild the scene's mesh array
    pScene->mNumMeshes = static_cast<unsigned int>(meshes.size());
    delete [] pScene->mMeshes;
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    std::copy( meshes.begin(), meshes.end(), pScene->mMeshes);

    // recurse through all nodes and translate the node's mesh indices to fit the new mesh array
    UpdateNode( pScene->mRootNode);

    ASSIMP_LOG_DEBUG( format() << "SplitByBoneCountProcess end: split " << mSubMeshIndices.size() << " meshes into " << meshes.size() << " submeshes." );
}